

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

uint8_t wabt::anon_unknown_1::log2_u32(uint32_t x)

{
  uint8_t result;
  uint8_t uVar1;
  
  uVar1 = '\0';
  for (; 1 < x; x = x >> 1) {
    uVar1 = uVar1 + '\x01';
  }
  return uVar1;
}

Assistant:

static uint8_t log2_u32(uint32_t x) {
  uint8_t result = 0;
  while (x > 1) {
    x >>= 1;
    result++;
  }
  return result;
}